

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O3

void __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson
          (PersistentStorageJson *this)

{
  ~PersistentStorageJson(this);
  operator_delete(this);
  return;
}

Assistant:

PersistentStorageJson::~PersistentStorageJson()
{
    Close();
    mCache.clear();
    SemaphoreClose(mStorageLock);
}